

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int liq_lookup(char *name)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar2;
  anon_class_8_1_898f2789_for__M_pred in_RDI;
  __normal_iterator<const_liq_type_*,_std::vector<liq_type,_std::allocator<liq_type>_>_> it;
  vector<liq_type,_std::allocator<liq_type>_> *in_stack_ffffffffffffffb8;
  int iVar3;
  __normal_iterator<const_liq_type_*,_std::vector<liq_type,_std::allocator<liq_type>_>_>
  *in_stack_ffffffffffffffc0;
  
  __first = std::vector<liq_type,_std::allocator<liq_type>_>::begin(in_stack_ffffffffffffffb8);
  __last = std::vector<liq_type,_std::allocator<liq_type>_>::end(in_stack_ffffffffffffffb8);
  std::
  find_if<__gnu_cxx::__normal_iterator<liq_type_const*,std::vector<liq_type,std::allocator<liq_type>>>,liq_lookup(char_const*)::__0>
            ((__normal_iterator<const_liq_type_*,_std::vector<liq_type,_std::allocator<liq_type>_>_>
             )__first._M_current,
             (__normal_iterator<const_liq_type_*,_std::vector<liq_type,_std::allocator<liq_type>_>_>
             )__last._M_current,in_RDI);
  std::vector<liq_type,_std::allocator<liq_type>_>::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffffc0,
                     (__normal_iterator<const_liq_type_*,_std::vector<liq_type,_std::allocator<liq_type>_>_>
                      *)in_stack_ffffffffffffffb8);
  if (bVar1) {
    std::vector<liq_type,_std::allocator<liq_type>_>::begin(in_stack_ffffffffffffffb8);
    dVar2 = __gnu_cxx::operator-
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_liq_type_*,_std::vector<liq_type,_std::allocator<liq_type>_>_>
                        *)in_stack_ffffffffffffffb8);
    iVar3 = (int)dVar2;
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int liq_lookup(const char *name)
{
	auto it = std::find_if(liq_table.begin(), liq_table.end(), [name] (auto liquid) {
		return liquid.liq_name != nullptr && !str_prefix(name, liquid.liq_name);
	});

	return it != liq_table.end()
		? it - liq_table.begin()
		: 0;
}